

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *method,Reader *replacement)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  Fault f;
  anon_class_8_1_60e9c21f _kjContextFunc916;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:916:5)>
  _kjContext916;
  Fault local_88;
  Reader *local_80;
  Context local_78;
  Reader **local_30;
  
  local_80 = method;
  kj::_::Debug::Context::Context(&local_78);
  local_78.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)&PTR__Context_0064a160;
  uVar1 = (method->_reader).dataSize;
  if (uVar1 < 0x80) {
    lVar3 = 0;
  }
  else {
    lVar3 = *(long *)((long)(method->_reader).data + 8);
  }
  uVar2 = (replacement->_reader).dataSize;
  if (uVar2 < 0x80) {
    lVar4 = 0;
  }
  else {
    lVar4 = *(long *)((long)(replacement->_reader).data + 8);
  }
  local_30 = &local_80;
  if (lVar3 == lVar4) {
    if (uVar1 < 0xc0) {
      lVar3 = 0;
    }
    else {
      lVar3 = *(long *)((long)(method->_reader).data + 0x10);
    }
    if (uVar2 < 0xc0) {
      lVar4 = 0;
    }
    else {
      lVar4 = *(long *)((long)(replacement->_reader).data + 0x10);
    }
    if (lVar3 != lVar4) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
                (&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x39a,FAILED,"method.getResultStructType() == replacement.getResultStructType()",
                 "\"Updated method has different results.\"",
                 (char (*) [38])"Updated method has different results.");
      this->compatibility = INCOMPATIBLE;
      kj::_::Debug::Fault::~Fault(&local_88);
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x398,FAILED,"method.getParamStructType() == replacement.getParamStructType()",
               "\"Updated method has different parameters.\"",
               (char (*) [41])"Updated method has different parameters.");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&local_88);
  }
  kj::_::Debug::Context::~Context(&local_78);
  return;
}

Assistant:

void checkCompatibility(const schema::Method::Reader& method,
                          const schema::Method::Reader& replacement) {
    KJ_CONTEXT("comparing method", method.getName());

    // TODO(someday):  Allow named parameter list to be replaced by compatible struct type.
    VALIDATE_SCHEMA(method.getParamStructType() == replacement.getParamStructType(),
                    "Updated method has different parameters.");
    VALIDATE_SCHEMA(method.getResultStructType() == replacement.getResultStructType(),
                    "Updated method has different results.");
  }